

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.c
# Opt level: O0

void run_collapse_init_task(parallel_task_1d *task,size_t thread_id)

{
  ulong uVar1;
  work_fn_t p_Var2;
  bvh_node *node;
  size_t n;
  size_t i;
  collapse_init_task *collapse_init_task;
  size_t thread_id_local;
  parallel_task_1d *task_local;
  
  uVar1 = (task->range).end;
  for (n = (task->range).begin; n < uVar1; n = n + 1) {
    p_Var2 = task[1].work_item.work_fn;
    (&(task[1].work_item.next)->work_fn)[n] = (work_fn_t)0x1;
    *(undefined4 *)(task[1].range.end + n * 4) = 0;
    if (*(int *)(p_Var2 + n * 0x20 + 0x18) == 0) {
      *(size_t *)(task[1].range.begin + (ulong)*(uint *)(p_Var2 + n * 0x20 + 0x1c) * 8) = n;
      *(size_t *)(task[1].range.begin + (ulong)(*(int *)(p_Var2 + n * 0x20 + 0x1c) + 1) * 8) = n;
    }
  }
  return;
}

Assistant:

static void run_collapse_init_task(struct parallel_task_1d* task, size_t thread_id) {
    IGNORE(thread_id);
    struct collapse_init_task* collapse_init_task = (void*)task;
    for (size_t i = task->range.begin, n = task->range.end; i < n; ++i) {
        const struct bvh_node* node = &collapse_init_task->nodes[i];
        collapse_init_task->node_counts[i] = 1;
        atomic_init(&collapse_init_task->flags[i], 0);
        if (node->primitive_count == 0) {
            collapse_init_task->parents[node->first_child_or_primitive + 0] = i;
            collapse_init_task->parents[node->first_child_or_primitive + 1] = i;
        }
    }
}